

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  char cVar20;
  int iVar21;
  undefined4 uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  uint uVar32;
  float fVar33;
  uint uVar34;
  float fVar35;
  uint uVar36;
  vint4 ai;
  float fVar37;
  uint uVar38;
  float fVar39;
  uint uVar40;
  float fVar42;
  float fVar44;
  vint4 ai_1;
  uint uVar43;
  uint uVar45;
  float fVar46;
  uint uVar47;
  undefined1 auVar41 [16];
  uint uVar48;
  uint uVar49;
  uint uVar50;
  vint4 ai_2;
  uint uVar51;
  float fVar52;
  uint uVar53;
  float fVar54;
  float fVar55;
  uint uVar56;
  float fVar57;
  float fVar58;
  uint uVar59;
  float fVar60;
  vint4 ai_3;
  float fVar61;
  uint uVar62;
  float fVar63;
  undefined1 auVar64 [16];
  vint4 bi;
  vint4 bi_2;
  float fVar65;
  float fVar69;
  float fVar70;
  vint4 bi_7;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  undefined1 auVar68 [16];
  float fVar72;
  float fVar76;
  float fVar77;
  vint4 bi_4;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
  puVar28 = local_7d0;
LAB_0072180b:
  puVar27 = puVar28;
  if (puVar27 == &local_7d8) {
LAB_00721bf8:
    return puVar27 != &local_7d8;
  }
  puVar28 = puVar27 + -1;
  uVar29 = puVar27[-1];
LAB_0072181f:
  iVar21 = (int)(uVar29 & 0xf);
  if ((uVar29 & 0xf) == 0) {
    pfVar1 = (float *)(uVar29 + 0x20 + uVar25);
    fVar31 = (*pfVar1 - fVar2) * fVar8;
    fVar33 = (pfVar1[1] - fVar2) * fVar8;
    fVar35 = (pfVar1[2] - fVar2) * fVar8;
    fVar37 = (pfVar1[3] - fVar2) * fVar8;
    pfVar1 = (float *)(uVar29 + 0x20 + uVar30);
    fVar39 = (*pfVar1 - fVar3) * fVar9;
    fVar42 = (pfVar1[1] - fVar3) * fVar9;
    fVar44 = (pfVar1[2] - fVar3) * fVar9;
    fVar46 = (pfVar1[3] - fVar3) * fVar9;
    uVar40 = (uint)((int)fVar39 < (int)fVar31) * (int)fVar31 |
             (uint)((int)fVar39 >= (int)fVar31) * (int)fVar39;
    uVar43 = (uint)((int)fVar42 < (int)fVar33) * (int)fVar33 |
             (uint)((int)fVar42 >= (int)fVar33) * (int)fVar42;
    uVar45 = (uint)((int)fVar44 < (int)fVar35) * (int)fVar35 |
             (uint)((int)fVar44 >= (int)fVar35) * (int)fVar44;
    uVar47 = (uint)((int)fVar46 < (int)fVar37) * (int)fVar37 |
             (uint)((int)fVar46 >= (int)fVar37) * (int)fVar46;
    pfVar1 = (float *)(uVar29 + 0x20 + uVar26);
    fVar31 = (*pfVar1 - fVar4) * fVar10;
    fVar33 = (pfVar1[1] - fVar4) * fVar10;
    fVar35 = (pfVar1[2] - fVar4) * fVar10;
    fVar37 = (pfVar1[3] - fVar4) * fVar10;
    pfVar1 = (float *)(uVar29 + 0x20 + (uVar25 ^ 0x10));
    fVar39 = (*pfVar1 - fVar2) * fVar8;
    fVar42 = (pfVar1[1] - fVar2) * fVar8;
    fVar44 = (pfVar1[2] - fVar2) * fVar8;
    fVar46 = (pfVar1[3] - fVar2) * fVar8;
    pfVar1 = (float *)(uVar29 + 0x20 + (uVar30 ^ 0x10));
    fVar52 = (*pfVar1 - fVar3) * fVar9;
    fVar55 = (pfVar1[1] - fVar3) * fVar9;
    fVar58 = (pfVar1[2] - fVar3) * fVar9;
    fVar61 = (pfVar1[3] - fVar3) * fVar9;
    uVar53 = (uint)((int)fVar39 < (int)fVar52) * (int)fVar39 |
             (uint)((int)fVar39 >= (int)fVar52) * (int)fVar52;
    uVar56 = (uint)((int)fVar42 < (int)fVar55) * (int)fVar42 |
             (uint)((int)fVar42 >= (int)fVar55) * (int)fVar55;
    uVar59 = (uint)((int)fVar44 < (int)fVar58) * (int)fVar44 |
             (uint)((int)fVar44 >= (int)fVar58) * (int)fVar58;
    uVar62 = (uint)((int)fVar46 < (int)fVar61) * (int)fVar46 |
             (uint)((int)fVar46 >= (int)fVar61) * (int)fVar61;
    pfVar1 = (float *)(uVar29 + 0x20 + (uVar26 ^ 0x10));
    fVar39 = (*pfVar1 - fVar4) * fVar10;
    fVar42 = (pfVar1[1] - fVar4) * fVar10;
    fVar44 = (pfVar1[2] - fVar4) * fVar10;
    fVar46 = (pfVar1[3] - fVar4) * fVar10;
    uVar32 = (uint)((int)fVar31 < iVar11) * iVar11 | (uint)((int)fVar31 >= iVar11) * (int)fVar31;
    uVar34 = (uint)((int)fVar33 < iVar11) * iVar11 | (uint)((int)fVar33 >= iVar11) * (int)fVar33;
    uVar36 = (uint)((int)fVar35 < iVar11) * iVar11 | (uint)((int)fVar35 >= iVar11) * (int)fVar35;
    uVar38 = (uint)((int)fVar37 < iVar11) * iVar11 | (uint)((int)fVar37 >= iVar11) * (int)fVar37;
    uVar48 = (uint)(iVar12 < (int)fVar39) * iVar12 | (uint)(iVar12 >= (int)fVar39) * (int)fVar39;
    uVar49 = (uint)(iVar12 < (int)fVar42) * iVar12 | (uint)(iVar12 >= (int)fVar42) * (int)fVar42;
    uVar50 = (uint)(iVar12 < (int)fVar44) * iVar12 | (uint)(iVar12 >= (int)fVar44) * (int)fVar44;
    uVar51 = (uint)(iVar12 < (int)fVar46) * iVar12 | (uint)(iVar12 >= (int)fVar46) * (int)fVar46;
    auVar14._4_4_ =
         -(uint)((int)(((int)uVar56 < (int)uVar49) * uVar56 | ((int)uVar56 >= (int)uVar49) * uVar49)
                < (int)(((int)uVar34 < (int)uVar43) * uVar43 | ((int)uVar34 >= (int)uVar43) * uVar34
                       ));
    auVar14._0_4_ =
         -(uint)((int)(((int)uVar53 < (int)uVar48) * uVar53 | ((int)uVar53 >= (int)uVar48) * uVar48)
                < (int)(((int)uVar32 < (int)uVar40) * uVar40 | ((int)uVar32 >= (int)uVar40) * uVar32
                       ));
    auVar14._8_4_ =
         -(uint)((int)(((int)uVar59 < (int)uVar50) * uVar59 | ((int)uVar59 >= (int)uVar50) * uVar50)
                < (int)(((int)uVar36 < (int)uVar45) * uVar45 | ((int)uVar36 >= (int)uVar45) * uVar36
                       ));
    auVar14._12_4_ =
         -(uint)((int)(((int)uVar62 < (int)uVar51) * uVar62 | ((int)uVar62 >= (int)uVar51) * uVar51)
                < (int)(((int)uVar38 < (int)uVar47) * uVar47 | ((int)uVar38 >= (int)uVar47) * uVar38
                       ));
    uVar22 = movmskps(iVar21,auVar14);
    bVar19 = (byte)uVar22 ^ 0xf;
  }
  else {
    if (iVar21 != 2) {
      cVar20 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar29 & 0xfffffffffffffff0) * 0x40 + 0x18))
                         (pre,ray,k,context);
      if (cVar20 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_00721bf8;
      }
      goto LAB_0072180b;
    }
    uVar23 = uVar29 & 0xfffffffffffffff0;
    auVar66._0_4_ =
         fVar5 * *(float *)(uVar23 + 0x20) +
         fVar6 * *(float *)(uVar23 + 0x50) + fVar7 * *(float *)(uVar23 + 0x80);
    auVar66._4_4_ =
         fVar5 * *(float *)(uVar23 + 0x24) +
         fVar6 * *(float *)(uVar23 + 0x54) + fVar7 * *(float *)(uVar23 + 0x84);
    auVar66._8_4_ =
         fVar5 * *(float *)(uVar23 + 0x28) +
         fVar6 * *(float *)(uVar23 + 0x58) + fVar7 * *(float *)(uVar23 + 0x88);
    auVar66._12_4_ =
         fVar5 * *(float *)(uVar23 + 0x2c) +
         fVar6 * *(float *)(uVar23 + 0x5c) + fVar7 * *(float *)(uVar23 + 0x8c);
    auVar73._0_4_ =
         fVar5 * *(float *)(uVar23 + 0x30) +
         fVar6 * *(float *)(uVar23 + 0x60) + fVar7 * *(float *)(uVar23 + 0x90);
    auVar73._4_4_ =
         fVar5 * *(float *)(uVar23 + 0x34) +
         fVar6 * *(float *)(uVar23 + 100) + fVar7 * *(float *)(uVar23 + 0x94);
    auVar73._8_4_ =
         fVar5 * *(float *)(uVar23 + 0x38) +
         fVar6 * *(float *)(uVar23 + 0x68) + fVar7 * *(float *)(uVar23 + 0x98);
    auVar73._12_4_ =
         fVar5 * *(float *)(uVar23 + 0x3c) +
         fVar6 * *(float *)(uVar23 + 0x6c) + fVar7 * *(float *)(uVar23 + 0x9c);
    auVar79._0_4_ =
         fVar5 * *(float *)(uVar23 + 0x40) +
         fVar6 * *(float *)(uVar23 + 0x70) + fVar7 * *(float *)(uVar23 + 0xa0);
    auVar79._4_4_ =
         fVar5 * *(float *)(uVar23 + 0x44) +
         fVar6 * *(float *)(uVar23 + 0x74) + fVar7 * *(float *)(uVar23 + 0xa4);
    auVar79._8_4_ =
         fVar5 * *(float *)(uVar23 + 0x48) +
         fVar6 * *(float *)(uVar23 + 0x78) + fVar7 * *(float *)(uVar23 + 0xa8);
    auVar79._12_4_ =
         fVar5 * *(float *)(uVar23 + 0x4c) +
         fVar6 * *(float *)(uVar23 + 0x7c) + fVar7 * *(float *)(uVar23 + 0xac);
    uVar32 = (uint)DAT_01f46710;
    uVar34 = DAT_01f46710._4_4_;
    uVar36 = DAT_01f46710._8_4_;
    uVar38 = DAT_01f46710._12_4_;
    fVar31 = (float)DAT_01f4bd50;
    fVar33 = DAT_01f4bd50._4_4_;
    fVar35 = DAT_01f4bd50._8_4_;
    fVar37 = DAT_01f4bd50._12_4_;
    auVar67._4_4_ = -(uint)((float)((uint)auVar66._4_4_ & uVar34) < fVar33);
    auVar67._0_4_ = -(uint)((float)((uint)auVar66._0_4_ & uVar32) < fVar31);
    auVar67._8_4_ = -(uint)((float)((uint)auVar66._8_4_ & uVar36) < fVar35);
    auVar67._12_4_ = -(uint)((float)((uint)auVar66._12_4_ & uVar38) < fVar37);
    auVar67 = blendvps(auVar66,_DAT_01f4bd50,auVar67);
    auVar74._4_4_ = -(uint)((float)((uint)auVar73._4_4_ & uVar34) < fVar33);
    auVar74._0_4_ = -(uint)((float)((uint)auVar73._0_4_ & uVar32) < fVar31);
    auVar74._8_4_ = -(uint)((float)((uint)auVar73._8_4_ & uVar36) < fVar35);
    auVar74._12_4_ = -(uint)((float)((uint)auVar73._12_4_ & uVar38) < fVar37);
    auVar74 = blendvps(auVar73,_DAT_01f4bd50,auVar74);
    auVar80._4_4_ = -(uint)((float)((uint)auVar79._4_4_ & uVar34) < fVar33);
    auVar80._0_4_ = -(uint)((float)((uint)auVar79._0_4_ & uVar32) < fVar31);
    auVar80._8_4_ = -(uint)((float)((uint)auVar79._8_4_ & uVar36) < fVar35);
    auVar80._12_4_ = -(uint)((float)((uint)auVar79._12_4_ & uVar38) < fVar37);
    auVar80 = blendvps(auVar79,_DAT_01f4bd50,auVar80);
    auVar81 = rcpps(_DAT_01f46710,auVar67);
    fVar31 = auVar81._0_4_;
    fVar33 = auVar81._4_4_;
    fVar35 = auVar81._8_4_;
    fVar37 = auVar81._12_4_;
    fVar31 = (1.0 - auVar67._0_4_ * fVar31) * fVar31 + fVar31;
    fVar33 = (1.0 - auVar67._4_4_ * fVar33) * fVar33 + fVar33;
    fVar35 = (1.0 - auVar67._8_4_ * fVar35) * fVar35 + fVar35;
    fVar37 = (1.0 - auVar67._12_4_ * fVar37) * fVar37 + fVar37;
    auVar67 = rcpps(auVar81,auVar74);
    fVar65 = auVar67._0_4_;
    fVar69 = auVar67._4_4_;
    fVar70 = auVar67._8_4_;
    fVar71 = auVar67._12_4_;
    fVar65 = (1.0 - auVar74._0_4_ * fVar65) * fVar65 + fVar65;
    fVar69 = (1.0 - auVar74._4_4_ * fVar69) * fVar69 + fVar69;
    fVar70 = (1.0 - auVar74._8_4_ * fVar70) * fVar70 + fVar70;
    fVar71 = (1.0 - auVar74._12_4_ * fVar71) * fVar71 + fVar71;
    auVar67 = rcpps(auVar67,auVar80);
    fVar72 = auVar67._0_4_;
    fVar76 = auVar67._4_4_;
    fVar77 = auVar67._8_4_;
    fVar78 = auVar67._12_4_;
    fVar72 = (1.0 - auVar80._0_4_ * fVar72) * fVar72 + fVar72;
    fVar76 = (1.0 - auVar80._4_4_ * fVar76) * fVar76 + fVar76;
    fVar77 = (1.0 - auVar80._8_4_ * fVar77) * fVar77 + fVar77;
    fVar78 = (1.0 - auVar80._12_4_ * fVar78) * fVar78 + fVar78;
    fVar54 = (*(float *)(uVar23 + 0x20) * fVar2 +
             *(float *)(uVar23 + 0x50) * fVar3 +
             *(float *)(uVar23 + 0x80) * fVar4 + *(float *)(uVar23 + 0xb0)) * -fVar31;
    fVar57 = (*(float *)(uVar23 + 0x24) * fVar2 +
             *(float *)(uVar23 + 0x54) * fVar3 +
             *(float *)(uVar23 + 0x84) * fVar4 + *(float *)(uVar23 + 0xb4)) * -fVar33;
    fVar60 = (*(float *)(uVar23 + 0x28) * fVar2 +
             *(float *)(uVar23 + 0x58) * fVar3 +
             *(float *)(uVar23 + 0x88) * fVar4 + *(float *)(uVar23 + 0xb8)) * -fVar35;
    fVar63 = (*(float *)(uVar23 + 0x2c) * fVar2 +
             *(float *)(uVar23 + 0x5c) * fVar3 +
             *(float *)(uVar23 + 0x8c) * fVar4 + *(float *)(uVar23 + 0xbc)) * -fVar37;
    fVar52 = (*(float *)(uVar23 + 0x30) * fVar2 +
             *(float *)(uVar23 + 0x60) * fVar3 +
             *(float *)(uVar23 + 0x90) * fVar4 + *(float *)(uVar23 + 0xc0)) * -fVar65;
    fVar55 = (*(float *)(uVar23 + 0x34) * fVar2 +
             *(float *)(uVar23 + 100) * fVar3 +
             *(float *)(uVar23 + 0x94) * fVar4 + *(float *)(uVar23 + 0xc4)) * -fVar69;
    fVar58 = (*(float *)(uVar23 + 0x38) * fVar2 +
             *(float *)(uVar23 + 0x68) * fVar3 +
             *(float *)(uVar23 + 0x98) * fVar4 + *(float *)(uVar23 + 200)) * -fVar70;
    fVar61 = (*(float *)(uVar23 + 0x3c) * fVar2 +
             *(float *)(uVar23 + 0x6c) * fVar3 +
             *(float *)(uVar23 + 0x9c) * fVar4 + *(float *)(uVar23 + 0xcc)) * -fVar71;
    fVar39 = (*(float *)(uVar23 + 0x40) * fVar2 +
             *(float *)(uVar23 + 0x70) * fVar3 +
             *(float *)(uVar23 + 0xa0) * fVar4 + *(float *)(uVar23 + 0xd0)) * -fVar72;
    fVar42 = (*(float *)(uVar23 + 0x44) * fVar2 +
             *(float *)(uVar23 + 0x74) * fVar3 +
             *(float *)(uVar23 + 0xa4) * fVar4 + *(float *)(uVar23 + 0xd4)) * -fVar76;
    fVar44 = (*(float *)(uVar23 + 0x48) * fVar2 +
             *(float *)(uVar23 + 0x78) * fVar3 +
             *(float *)(uVar23 + 0xa8) * fVar4 + *(float *)(uVar23 + 0xd8)) * -fVar77;
    fVar46 = (*(float *)(uVar23 + 0x4c) * fVar2 +
             *(float *)(uVar23 + 0x7c) * fVar3 +
             *(float *)(uVar23 + 0xac) * fVar4 + *(float *)(uVar23 + 0xdc)) * -fVar78;
    fVar31 = fVar31 + fVar54;
    fVar33 = fVar33 + fVar57;
    fVar35 = fVar35 + fVar60;
    fVar37 = fVar37 + fVar63;
    fVar65 = fVar65 + fVar52;
    fVar69 = fVar69 + fVar55;
    fVar70 = fVar70 + fVar58;
    fVar71 = fVar71 + fVar61;
    fVar72 = fVar72 + fVar39;
    fVar76 = fVar76 + fVar42;
    fVar77 = fVar77 + fVar44;
    fVar78 = fVar78 + fVar46;
    auVar64._0_4_ =
         (uint)((int)fVar65 < (int)fVar52) * (int)fVar65 |
         (uint)((int)fVar65 >= (int)fVar52) * (int)fVar52;
    auVar64._4_4_ =
         (uint)((int)fVar69 < (int)fVar55) * (int)fVar69 |
         (uint)((int)fVar69 >= (int)fVar55) * (int)fVar55;
    auVar64._8_4_ =
         (uint)((int)fVar70 < (int)fVar58) * (int)fVar70 |
         (uint)((int)fVar70 >= (int)fVar58) * (int)fVar58;
    auVar64._12_4_ =
         (uint)((int)fVar71 < (int)fVar61) * (int)fVar71 |
         (uint)((int)fVar71 >= (int)fVar61) * (int)fVar61;
    auVar15._4_4_ =
         (uint)((int)fVar76 < (int)fVar42) * (int)fVar76 |
         (uint)((int)fVar76 >= (int)fVar42) * (int)fVar42;
    auVar15._0_4_ =
         (uint)((int)fVar72 < (int)fVar39) * (int)fVar72 |
         (uint)((int)fVar72 >= (int)fVar39) * (int)fVar39;
    auVar15._8_4_ =
         (uint)((int)fVar77 < (int)fVar44) * (int)fVar77 |
         (uint)((int)fVar77 >= (int)fVar44) * (int)fVar44;
    auVar15._12_4_ =
         (uint)((int)fVar78 < (int)fVar46) * (int)fVar78 |
         (uint)((int)fVar78 >= (int)fVar46) * (int)fVar46;
    auVar74 = maxps(auVar64,auVar15);
    auVar68._0_4_ =
         (uint)((int)fVar65 < (int)fVar52) * (int)fVar52 |
         (uint)((int)fVar65 >= (int)fVar52) * (int)fVar65;
    auVar68._4_4_ =
         (uint)((int)fVar69 < (int)fVar55) * (int)fVar55 |
         (uint)((int)fVar69 >= (int)fVar55) * (int)fVar69;
    auVar68._8_4_ =
         (uint)((int)fVar70 < (int)fVar58) * (int)fVar58 |
         (uint)((int)fVar70 >= (int)fVar58) * (int)fVar70;
    auVar68._12_4_ =
         (uint)((int)fVar71 < (int)fVar61) * (int)fVar61 |
         (uint)((int)fVar71 >= (int)fVar61) * (int)fVar71;
    auVar75._0_4_ =
         (uint)((int)fVar72 < (int)fVar39) * (int)fVar39 |
         (uint)((int)fVar72 >= (int)fVar39) * (int)fVar72;
    auVar75._4_4_ =
         (uint)((int)fVar76 < (int)fVar42) * (int)fVar42 |
         (uint)((int)fVar76 >= (int)fVar42) * (int)fVar76;
    auVar75._8_4_ =
         (uint)((int)fVar77 < (int)fVar44) * (int)fVar44 |
         (uint)((int)fVar77 >= (int)fVar44) * (int)fVar77;
    auVar75._12_4_ =
         (uint)((int)fVar78 < (int)fVar46) * (int)fVar46 |
         (uint)((int)fVar78 >= (int)fVar46) * (int)fVar78;
    auVar80 = minps(auVar68,auVar75);
    auVar18._4_4_ = iVar11;
    auVar18._0_4_ = iVar11;
    auVar18._8_4_ = iVar11;
    auVar18._12_4_ = iVar11;
    auVar16._4_4_ =
         (uint)((int)fVar33 < (int)fVar57) * (int)fVar33 |
         (uint)((int)fVar33 >= (int)fVar57) * (int)fVar57;
    auVar16._0_4_ =
         (uint)((int)fVar31 < (int)fVar54) * (int)fVar31 |
         (uint)((int)fVar31 >= (int)fVar54) * (int)fVar54;
    auVar16._8_4_ =
         (uint)((int)fVar35 < (int)fVar60) * (int)fVar35 |
         (uint)((int)fVar35 >= (int)fVar60) * (int)fVar60;
    auVar16._12_4_ =
         (uint)((int)fVar37 < (int)fVar63) * (int)fVar37 |
         (uint)((int)fVar37 >= (int)fVar63) * (int)fVar63;
    auVar67 = maxps(auVar18,auVar16);
    auVar67 = maxps(auVar67,auVar74);
    auVar17._4_4_ = iVar12;
    auVar17._0_4_ = iVar12;
    auVar17._8_4_ = iVar12;
    auVar17._12_4_ = iVar12;
    auVar81._4_4_ =
         (uint)((int)fVar33 < (int)fVar57) * (int)fVar57 |
         (uint)((int)fVar33 >= (int)fVar57) * (int)fVar33;
    auVar81._0_4_ =
         (uint)((int)fVar31 < (int)fVar54) * (int)fVar54 |
         (uint)((int)fVar31 >= (int)fVar54) * (int)fVar31;
    auVar81._8_4_ =
         (uint)((int)fVar35 < (int)fVar60) * (int)fVar60 |
         (uint)((int)fVar35 >= (int)fVar60) * (int)fVar35;
    auVar81._12_4_ =
         (uint)((int)fVar37 < (int)fVar63) * (int)fVar63 |
         (uint)((int)fVar37 >= (int)fVar63) * (int)fVar37;
    auVar74 = minps(auVar17,auVar81);
    auVar74 = minps(auVar74,auVar80);
    auVar41._4_4_ = -(uint)(auVar67._4_4_ <= auVar74._4_4_);
    auVar41._0_4_ = -(uint)(auVar67._0_4_ <= auVar74._0_4_);
    auVar41._8_4_ = -(uint)(auVar67._8_4_ <= auVar74._8_4_);
    auVar41._12_4_ = -(uint)(auVar67._12_4_ <= auVar74._12_4_);
    uVar22 = movmskps((int)uVar23,auVar41);
    bVar19 = (byte)uVar22;
  }
  if (bVar19 == 0) goto LAB_0072180b;
  uVar23 = uVar29 & 0xfffffffffffffff0;
  lVar13 = 0;
  if (bVar19 != 0) {
    for (; (bVar19 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  uVar29 = *(ulong *)(uVar23 + lVar13 * 8);
  uVar32 = bVar19 - 1 & (uint)bVar19;
  uVar24 = (ulong)uVar32;
  if (uVar32 != 0) {
    do {
      *puVar28 = uVar29;
      puVar28 = puVar28 + 1;
      lVar13 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar29 = *(ulong *)(uVar23 + lVar13 * 8);
      uVar24 = uVar24 - 1 & uVar24;
    } while (uVar24 != 0);
  }
  goto LAB_0072181f;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }